

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

void __thiscall irr::scene::CSceneManager::~CSceneManager(CSceneManager *this,void **vtt)

{
  u32 uVar1;
  undefined8 *in_RSI;
  CSceneManager *in_RDI;
  u32 i;
  undefined4 in_stack_ffffffffffffffc8;
  u32 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar2;
  uint local_14;
  
  (in_RDI->super_ISceneManager)._vptr_ISceneManager = (_func_int **)*in_RSI;
  *(undefined8 *)
   ((long)&(in_RDI->super_ISceneManager)._vptr_ISceneManager +
   (long)(in_RDI->super_ISceneManager)._vptr_ISceneManager[-3]) = in_RSI[5];
  *(undefined8 *)&(in_RDI->super_ISceneManager).field_0x8 = in_RSI[6];
  clearDeletionList(in_RDI);
  if (in_RDI->Driver != (IVideoDriver *)0x0) {
    (*in_RDI->Driver->_vptr_IVideoDriver[0x19])();
  }
  if (in_RDI->CursorControl != (ICursorControl *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  if (in_RDI->CollisionManager != (ISceneCollisionManager *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  local_14 = 0;
  while( true ) {
    uVar2 = local_14;
    uVar1 = core::array<irr::scene::IMeshLoader_*>::size
                      ((array<irr::scene::IMeshLoader_*> *)0x2f9d67);
    if (uVar1 <= uVar2) break;
    core::array<irr::scene::IMeshLoader_*>::operator[]
              ((array<irr::scene::IMeshLoader_*> *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_14 = local_14 + 1;
  }
  if (in_RDI->ActiveCamera != (ICameraSceneNode *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  in_RDI->ActiveCamera = (ICameraSceneNode *)0x0;
  if (in_RDI->MeshCache != (IMeshCache *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  if (in_RDI->Parameters != (CAttributes *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  (*(in_RDI->super_ISceneManager)._vptr_ISceneManager[0x28])();
  if (in_RDI->Driver != (IVideoDriver *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  core::array<irr::scene::ISceneNode_*>::~array((array<irr::scene::ISceneNode_*> *)0x2f9e68);
  core::array<irr::scene::IMeshLoader_*>::~array((array<irr::scene::IMeshLoader_*> *)0x2f9e79);
  core::array<irr::scene::ISceneNode_*>::~array((array<irr::scene::ISceneNode_*> *)0x2f9e8a);
  core::array<irr::scene::CSceneManager::TransparentNodeEntry>::~array
            ((array<irr::scene::CSceneManager::TransparentNodeEntry> *)0x2f9e9b);
  core::array<irr::scene::CSceneManager::TransparentNodeEntry>::~array
            ((array<irr::scene::CSceneManager::TransparentNodeEntry> *)0x2f9eac);
  core::array<irr::scene::CSceneManager::DefaultNodeEntry>::~array
            ((array<irr::scene::CSceneManager::DefaultNodeEntry> *)0x2f9ebd);
  core::array<irr::scene::ISceneNode_*>::~array((array<irr::scene::ISceneNode_*> *)0x2f9ece);
  core::array<irr::scene::ISceneNode_*>::~array((array<irr::scene::ISceneNode_*> *)0x2f9edf);
  ISceneNode::~ISceneNode
            ((ISceneNode *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
             (void **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  ISceneManager::~ISceneManager(&in_RDI->super_ISceneManager,(void **)(in_RSI + 1));
  return;
}

Assistant:

CSceneManager::~CSceneManager()
{
	clearDeletionList();

	//! force to remove hardwareTextures from the driver
	//! because Scenes may hold internally data bounded to sceneNodes
	//! which may be destroyed twice
	if (Driver)
		Driver->removeAllHardwareBuffers();

	if (CursorControl)
		CursorControl->drop();

	if (CollisionManager)
		CollisionManager->drop();

	u32 i;
	for (i = 0; i < MeshLoaderList.size(); ++i)
		MeshLoaderList[i]->drop();

	if (ActiveCamera)
		ActiveCamera->drop();
	ActiveCamera = 0;

	if (MeshCache)
		MeshCache->drop();

	if (Parameters)
		Parameters->drop();

	// remove all nodes before dropping the driver
	// as render targets may be destroyed twice

	removeAll();

	if (Driver)
		Driver->drop();
}